

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# am_map.cpp
# Opt level: O3

void AM_rotate(double *xp,double *yp,DAngle *a)

{
  double dVar1;
  double dVar2;
  
  if (AM_rotate(double*,double*,TAngle<double>)::angle_saved == '\0') {
    AM_rotate();
  }
  dVar1 = a->Degrees;
  if ((AM_rotate::angle_saved.Degrees != dVar1) ||
     (NAN(AM_rotate::angle_saved.Degrees) || NAN(dVar1))) {
    AM_rotate::angle_saved.Degrees = dVar1;
    AM_rotate::sinrot = sin(a->Degrees * 0.017453292519943295);
    AM_rotate::cosrot = cos(a->Degrees * 0.017453292519943295);
  }
  dVar1 = *xp * AM_rotate::sinrot;
  dVar2 = *yp * AM_rotate::cosrot;
  *xp = *xp * AM_rotate::cosrot - *yp * AM_rotate::sinrot;
  *yp = dVar2 + dVar1;
  return;
}

Assistant:

void AM_rotate(double *xp, double *yp, DAngle a)
{
	static DAngle angle_saved = 0.;
	static double sinrot = 0;
	static double cosrot = 1;

	if (angle_saved != a)
	{
		angle_saved = a;
		sinrot = sin(a.Radians());
		cosrot = cos(a.Radians());
	}

	double x = *xp;
	double y = *yp;
	double tmpx = (x * cosrot) - (y * sinrot);
	y = (x * sinrot) + (y * cosrot);
	x = tmpx;
	*xp = x;
	*yp = y;
}